

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

bool crnlib::image_utils::read_from_stream_stb(data_stream_serializer *serializer,image_u8 *img)

{
  uint uVar1;
  uchar *puVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uint uVar6;
  color_quad<unsigned_char,_int> *pcVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  byte bVar11;
  void *pvVar13;
  void *pvVar14;
  ulong uVar15;
  bool bVar16;
  uchar uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  stbi__result_info *in_R9;
  long lVar22;
  long lVar23;
  long in_FS_OFFSET;
  int y;
  int x;
  int n;
  uint8_vec buf;
  int in_stack_fffffffffffffe88;
  uint local_168;
  uint local_164;
  image_u8 *local_160;
  int local_154;
  void *local_150;
  vector<unsigned_char> local_148;
  long local_130;
  long local_128;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_120;
  int local_11c [3];
  stbi__context local_110;
  byte bVar12;
  
  local_148.m_p = (uchar *)0x0;
  local_148.m_size = 0;
  local_148.m_capacity = 0;
  local_160 = img;
  bVar10 = data_stream::read_array(serializer->m_pStream,&local_148);
  bVar16 = false;
  if (bVar10) {
    local_164 = 0;
    local_168 = 0;
    local_154 = 0;
    local_110.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
    local_110.read_from_callbacks = 0;
    local_110.callback_already_read = 0;
    local_110.img_buffer_original = local_148.m_p;
    local_110.img_buffer = local_148.m_p;
    local_110.img_buffer_end = local_148.m_p + (int)local_148.m_size;
    local_110.img_buffer_original_end = local_110.img_buffer_end;
    pvVar13 = stbi__load_main(&local_110,(int *)&local_164,(int *)&local_168,&local_154,
                              (int)local_11c,in_R9,in_stack_fffffffffffffe88);
    if (pvVar13 == (void *)0x0) {
      pvVar13 = (void *)0x0;
    }
    else if (local_11c[0] != 8) {
      if (local_11c[0] != 0x10) {
        __assert_fail("ri.bits_per_channel == 8 || ri.bits_per_channel == 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/stb/stb_image.h"
                      ,0x4b9,
                      "unsigned char *stbi__load_and_postprocess_8bit(stbi__context *, int *, int *, int *, int)"
                     );
      }
      iVar18 = local_164 * local_168;
      uVar19 = iVar18 * 4;
      pvVar14 = malloc((long)(int)uVar19);
      if (pvVar14 == (void *)0x0) {
        *(char **)(in_FS_OFFSET + -8) = "outofmem";
        pvVar13 = (void *)0x0;
      }
      else {
        if (0 < iVar18 * 4) {
          uVar15 = 0;
          do {
            *(undefined1 *)((long)pvVar14 + uVar15) =
                 *(undefined1 *)((long)pvVar13 + uVar15 * 2 + 1);
            uVar15 = uVar15 + 1;
          } while (uVar19 != uVar15);
        }
        free(pvVar13);
        pvVar13 = pvVar14;
      }
      local_11c[0] = 8;
    }
    iVar18 = local_154;
    uVar9 = local_164;
    uVar19 = local_168;
    if (pvVar13 != (void *)0x0) {
      lVar23 = (long)(int)local_164;
      if ((int)local_168 < 0x4001 && lVar23 < 0x4001) {
        uVar15 = (ulong)local_168;
        uVar1 = local_154 - 2;
        local_120.m_u32 = 0xff000000;
        local_150 = pvVar13;
        image<crnlib::color_quad<unsigned_char,_int>_>::resize
                  (local_160,local_164,local_168,0xffffffff,
                   (color_quad<unsigned_char,_int> *)&local_120.field_0);
        if ((int)uVar19 < 1) {
          uVar19 = 0x1f;
        }
        else {
          local_130 = lVar23 * 4;
          bVar12 = 1;
          bVar11 = 1;
          iVar20 = 0;
          uVar21 = 0;
          pvVar13 = local_150;
          do {
            if (uVar9 != 0) {
              uVar6 = local_160->m_pitch;
              pcVar7 = local_160->m_pPixels;
              lVar22 = 0;
              bVar11 = bVar12;
              do {
                uVar17 = *(uchar *)((long)pvVar13 + lVar22 + 3);
                if ((iVar18 != 2) && (iVar18 != 4)) {
                  uVar17 = 0xff;
                }
                puVar2 = pcVar7[uVar6 * iVar20].field_0.c + lVar22;
                uVar3 = *(uchar *)((long)pvVar13 + lVar22);
                uVar4 = *(uchar *)((long)pvVar13 + lVar22 + 1);
                uVar5 = *(uchar *)((long)pvVar13 + lVar22 + 2);
                *puVar2 = uVar3;
                puVar2[1] = uVar4;
                if (uVar4 != uVar5 || uVar3 != uVar4) {
                  bVar11 = 0;
                }
                puVar2[2] = uVar5;
                puVar2[3] = uVar17;
                lVar22 = lVar22 + 4;
                bVar12 = bVar11;
              } while ((color_quad<unsigned_char,_int> *)(puVar2 + 4) !=
                       pcVar7 + (ulong)((int)uVar21 * uVar6) + lVar23);
            }
            uVar21 = uVar21 + 1;
            iVar20 = iVar20 + 1;
            pvVar13 = (void *)((long)pvVar13 + local_130);
          } while (uVar21 != uVar15);
          uVar19 = (uint)bVar11 << 4 | 0xf;
          local_128 = lVar23;
        }
        free(local_150);
        uVar8 = uVar19 & 0xfffffff7;
        if ((uVar1 & 0xfffffffd) == 0) {
          uVar8 = uVar19;
        }
        local_160->m_comp_flags = uVar8;
        bVar16 = true;
        goto LAB_00118685;
      }
      free(pvVar13);
    }
    bVar16 = false;
  }
LAB_00118685:
  if (local_148.m_p != (uchar *)0x0) {
    crnlib_free(local_148.m_p);
  }
  return bVar16;
}

Assistant:

bool read_from_stream_stb(data_stream_serializer& serializer, image_u8& img)
        {
            uint8_vec buf;
            if (!serializer.read_entire_file(buf))
            {
                return false;
            }

            int x = 0, y = 0, n = 0;
            unsigned char* pData = stbi_load_from_memory(buf.get_ptr(), buf.size_in_bytes(), &x, &y, &n, 4);

            if (!pData)
            {
                return false;
            }

            if ((x > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION) || (y > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION))
            {
                stbi_image_free(pData);
                return false;
            }

            const bool has_alpha = ((n == 2) || (n == 4));

            img.resize(x, y);

            bool grayscale = true;

            for (int py = 0; py < y; py++)
            {
                const color_quad_u8* pSrc = reinterpret_cast<const color_quad_u8*>(pData) + (py * x);
                color_quad_u8* pDst = img.get_scanline(py);
                color_quad_u8* pDst_end = pDst + x;

                while (pDst != pDst_end)
                {
                    color_quad_u8 c(*pSrc++);
                    if (!has_alpha)
                    {
                        c.a = 255;
                    }

                    if (!c.is_grayscale())
                    {
                        grayscale = false;
                    }

                    *pDst++ = c;
                }
            }

            stbi_image_free(pData);

            img.reset_comp_flags();
            img.set_grayscale(grayscale);
            img.set_component_valid(3, has_alpha);

            return true;
        }